

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::SetParam
            ((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x78);
  anon_unknown.dwarf_ec30ed::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test::
  AV1FwdTxfm2d_RunFwdAccuracyCheck_Test((AV1FwdTxfm2d_RunFwdAccuracyCheck_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }